

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t_conflict1 *
trng::utility::
u01xx_traits<long_double,_1UL,_generator_min<trng::lagfib2plus<unsigned_int,_168U,_521U>_>_>::
variate(generator_min<trng::lagfib2plus<unsigned_int,_168U,_521U>_> *r)

{
  ret_t_conflict1 *prVar1;
  size_t i;
  ret_t_conflict1 ret;
  ret_t_conflict1 scale_per_step;
  generator_min<trng::lagfib2plus<unsigned_int,_168U,_521U>_> *in_stack_ffffffffffffffd0;
  ret_t_conflict1 *prVar2;
  
  prVar1 = addin(in_stack_ffffffffffffffd0);
  prVar2 = (ret_t_conflict1 *)0x1;
  while (prVar2 == (ret_t_conflict1 *)0x0) {
    addin((generator_min<trng::lagfib2plus<unsigned_int,_168U,_521U>_> *)0x0);
    prVar1 = (ret_t_conflict1 *)((long)prVar2 + 1);
    prVar2 = prVar1;
  }
  return prVar1;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t variate(prng_t &r) {
        static_assert(prng_t::min() >= 0 and prng_t::max() > prng_t::min(),
                      "min max out of range");  // min and/or max out of spec?
        static_assert(prng_t::max() - prng_t::min() <= ~0ull,
                      "min max have exotic values/types");  // Bits, Holes incorrect otherwise
        static_assert(not math::numeric_limits<return_type>::is_integer, "not an integer");
        static_assert(calls_needed > 0 and calls_needed <= bits, "illegal number of calls");
        const ret_t scale_per_step(ret_t(domain_max) + 1);
        ret_t ret{addin(r)};
        for (std::size_t i{1}; i < calls_needed; ++i)
          ret = ret * scale_per_step + addin(r);
        return ret;
      }